

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

size_t dumpManifest(IDManifest *mfst)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  size_type sVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  long *plVar9;
  ulong uVar10;
  _Rb_tree_node_base *p_Var11;
  _Base_ptr *pp_Var12;
  size_t sVar13;
  char cVar14;
  _Base_ptr p_Var15;
  size_t c_1;
  bool bVar16;
  size_t c;
  ulong uVar17;
  string s;
  vector<unsigned_long,_std::allocator<unsigned_long>_> componentLength;
  string s_1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar17 = 0;
  sVar13 = 0;
  while( true ) {
    uVar4 = Imf_3_4::IDManifest::size();
    if (uVar4 <= uVar17) break;
    lVar5 = Imf_3_4::IDManifest::operator[]((ulong)mfst);
    if (uVar17 != 0) {
      std::operator<<((ostream *)&std::cout,"\n\n");
    }
    std::operator<<((ostream *)&std::cout," channels  : ");
    lVar6 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
    p_Var7 = *(_Rb_tree_node_base **)(lVar6 + 0x18);
    bVar16 = true;
    while( true ) {
      lVar6 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
      if (p_Var7 == (_Rb_tree_node_base *)(lVar6 + 8)) break;
      if (!bVar16) {
        std::operator<<((ostream *)&std::cout,',');
      }
      std::operator<<((ostream *)&std::cout,(string *)(p_Var7 + 1));
      sVar13 = (long)&(p_Var7[1]._M_parent)->_M_color + sVar13 + 1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      bVar16 = false;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"\n hashScheme: ");
    poVar8 = std::operator<<(poVar8,(string *)(lVar5 + 0x50));
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)&std::cout," encoding  : ");
    poVar8 = std::operator<<(poVar8,(string *)(lVar5 + 0x70));
    std::endl<char,std::char_traits<char>>(poVar8);
    if ((ulong)*(uint *)(lVar5 + 0x48) < 3) {
      std::operator<<((ostream *)&std::cout,
                      &DAT_001043ac + *(int *)(&DAT_001043ac + (ulong)*(uint *)(lVar5 + 0x48) * 4));
    }
    plVar9 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&componentLength,plVar9[1] - *plVar9 >> 5,(allocator_type *)&s);
    lVar5 = 8;
    uVar4 = 0;
    while( true ) {
      plVar9 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      if ((ulong)(plVar9[1] - *plVar9 >> 5) <= uVar4) break;
      plVar9 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      uVar10 = *(ulong *)(*plVar9 + lVar5);
      sVar13 = sVar13 + uVar10 + 1;
      if (uVar10 < componentLength.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4]) {
        uVar10 = componentLength.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar4];
      }
      componentLength.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = uVar10;
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    }
    p_Var7 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::begin();
    uVar4 = 0;
    while( true ) {
      p_Var11 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::end();
      if (p_Var7 == p_Var11) break;
      std::__cxx11::to_string(&s,*(unsigned_long *)(p_Var7 + 1));
      sVar3 = s._M_string_length;
      std::__cxx11::string::~string((string *)&s);
      sVar13 = sVar13 + sVar3;
      p_Var1 = p_Var7[1]._M_parent;
      p_Var2 = p_Var7[1]._M_left;
      pp_Var12 = &p_Var1->_M_parent;
      for (lVar5 = 0; (long)p_Var2 - (long)p_Var1 >> 5 != lVar5; lVar5 = lVar5 + 1) {
        p_Var15 = *pp_Var12;
        sVar13 = (long)&p_Var15->_M_color + sVar13 + 1;
        if (p_Var15 < (_Base_ptr)
                      componentLength.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5]) {
          p_Var15 = (_Base_ptr)
                    componentLength.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5];
        }
        componentLength.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] = (unsigned_long)p_Var15;
        pp_Var12 = pp_Var12 + 4;
      }
      if (uVar4 <= sVar3) {
        uVar4 = sVar3;
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"     ");
    cVar14 = (char)uVar4 + '\x01';
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::__cxx11::string::_M_construct((ulong)&s,cVar14);
    std::operator<<(poVar8,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    lVar5 = 0;
    uVar4 = 0;
    while( true ) {
      plVar9 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      if ((ulong)(plVar9[1] - *plVar9 >> 5) <= uVar4) break;
      plVar9 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      std::__cxx11::string::string((string *)&s,(string *)(*plVar9 + lVar5));
      poVar8 = std::operator<<((ostream *)&std::cout,(string *)&s);
      s_1._M_dataplus._M_p = (pointer)&s_1.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&s_1,
                 ((char)componentLength.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4] - (char)s._M_string_length) + '\x01'
                );
      std::operator<<(poVar8,(string *)&s_1);
      std::__cxx11::string::~string((string *)&s_1);
      std::__cxx11::string::~string((string *)&s);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    p_Var7 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::begin();
    while( true ) {
      p_Var11 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::end();
      if (p_Var7 == p_Var11) break;
      std::__cxx11::to_string(&s,*(unsigned_long *)(p_Var7 + 1));
      poVar8 = std::operator<<((ostream *)&std::cout,"     ");
      poVar8 = std::operator<<(poVar8,(string *)&s);
      s_1._M_dataplus._M_p = (pointer)&s_1.field_2;
      std::__cxx11::string::_M_construct((ulong)&s_1,cVar14 - (char)s._M_string_length);
      std::operator<<(poVar8,(string *)&s_1);
      std::__cxx11::string::~string((string *)&s_1);
      lVar5 = 0;
      for (uVar4 = 0; uVar4 < (ulong)((long)p_Var7[1]._M_left - (long)p_Var7[1]._M_parent >> 5);
          uVar4 = uVar4 + 1) {
        std::__cxx11::string::string
                  ((string *)&s_1,(string *)((long)&(p_Var7[1]._M_parent)->_M_color + lVar5));
        poVar8 = std::operator<<((ostream *)&std::cout,(string *)&s_1);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct
                  ((ulong)local_50,
                   ((char)componentLength.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4] - (char)s_1._M_string_length) +
                   '\x01');
        std::operator<<(poVar8,(string *)local_50);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string((string *)&s_1);
        lVar5 = lVar5 + 0x20;
      }
      std::operator<<((ostream *)&std::cout,'\n');
      std::__cxx11::string::~string((string *)&s);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&componentLength.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    uVar17 = uVar17 + 1;
  }
  return sVar13;
}

Assistant:

size_t
dumpManifest (const IDManifest& mfst)
{

    size_t uncompressedSize = 0;

    for (size_t i = 0; i < mfst.size (); ++i)
    {
        const IDManifest::ChannelGroupManifest& m     = mfst[i];
        bool                                    first = true;
        if (i > 0) { cout << "\n\n"; }
        cout << " channels  : ";
        for (set<string>::const_iterator s = m.getChannels ().begin ();
             s != m.getChannels ().end ();
             ++s)
        {
            if (!first) { cout << ','; }
            else { first = false; }

            cout << *s;
            uncompressedSize += s->size () + 1;
        }

        cout << "\n hashScheme: " << m.getHashScheme () << endl;
        cout << " encoding  : " << m.getEncodingScheme () << endl;
        switch (m.getLifetime ())
        {
            case IDManifest::LIFETIME_FRAME:
                cout << " lifetime  : frame\n";
                break;
            case IDManifest::LIFETIME_SHOT:
                cout << " lifetime  : shot\n";
                break;
            case IDManifest::LIFETIME_STABLE:
                cout << " lifetime  : stable\n";
                break;
        }

        //
        // compute max field sizes
        //
        size_t         maxNumLen = 0;
        vector<size_t> componentLength (m.getComponents ().size ());
        for (size_t c = 0; c < m.getComponents ().size (); ++c)
        {
            size_t componentSize = m.getComponents ()[c].size ();
            uncompressedSize += componentSize + 1;
            componentLength[c] = max (componentLength[c], componentSize);
        }
        for (IDManifest::ChannelGroupManifest::ConstIterator q = m.begin ();
             q != m.end ();
             ++q)
        {

            size_t stringLen = to_string (q.id ()).size ();
            uncompressedSize += stringLen;
            maxNumLen = max (maxNumLen, stringLen);

            for (size_t i = 0; i < q.text ().size (); i++)
            {
                uncompressedSize += q.text ()[i].size () + 1;
                componentLength[i] =
                    max (componentLength[i], q.text ()[i].size ());
            }
        }

        cout << "     " << string (maxNumLen + 1, ' ');
        for (size_t c = 0; c < m.getComponents ().size (); ++c)
        {
            string s = m.getComponents ()[c];
            cout << s << string (componentLength[c] + 1 - s.size (), ' ');
        }
        cout << endl;
        for (IDManifest::ChannelGroupManifest::ConstIterator q = m.begin ();
             q != m.end ();
             ++q)
        {
            string id = to_string (q.id ());
            cout << "     " << id << string (maxNumLen + 1 - id.size (), ' ');
            for (size_t i = 0; i < q.text ().size (); i++)
            {
                string s = q.text ()[i];
                cout << s << string (componentLength[i] + 1 - s.size (), ' ');
            }
            cout << '\n';
        }
    }

    return uncompressedSize;
}